

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  long lVar12;
  Mat *pMVar13;
  pointer piVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  void *pvVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  void *pvVar30;
  int iVar31;
  void *pvVar32;
  uint uVar33;
  size_type __n;
  long lVar34;
  undefined4 uVar35;
  float fVar36;
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int size_5;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_1a1;
  ulong local_1a0;
  void *local_198;
  void *local_190;
  ulong local_188;
  long local_180;
  float *local_178;
  void *local_170;
  void *local_168;
  ulong local_160;
  long local_158;
  void *local_150;
  Mat *local_148;
  void *local_140;
  void *local_138;
  ulong local_130;
  Mat local_128;
  Mat *local_e0;
  ulong local_d8;
  ulong local_d0;
  void *local_c8;
  long local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  Option *local_a8;
  ulong local_a0;
  void *local_98;
  long local_90;
  float *local_88;
  long local_80;
  void *local_78;
  long local_70;
  long local_68;
  void *local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_140 = (void *)(ulong)(uint)bottom_blob->c;
  iVar15 = this->group;
  iVar18 = -100;
  if (bottom_blob->c % iVar15 == 0) {
    iVar39 = this->num_output;
    if (iVar39 % iVar15 == 0) {
      iVar18 = bottom_blob->w;
      local_180 = (long)iVar18;
      uVar33 = bottom_blob->h;
      local_130 = (ulong)uVar33;
      iVar27 = this->kernel_w;
      iVar31 = this->dilation_w;
      sVar5 = bottom_blob->elemsize;
      iVar19 = this->stride_w;
      iVar20 = this->kernel_h;
      iVar23 = this->dilation_h;
      iVar29 = this->stride_h;
      iVar3 = this->output_pad_right;
      iVar4 = this->output_pad_bottom;
      local_128.cstep = 0;
      local_128.data = (void *)0x0;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize = 0;
      local_128.elempack = 0;
      local_128.allocator = (Allocator *)0x0;
      local_128.dims = 0;
      local_128.w = 0;
      local_128.h = 0;
      local_128.d = 0;
      local_128.c = 0;
      auVar37._0_4_ = -(uint)(0 < this->pad_left);
      auVar37._4_4_ = -(uint)(0 < this->pad_right);
      auVar37._8_4_ = -(uint)(0 < this->pad_top);
      auVar37._12_4_ = -(uint)(0 < this->pad_bottom);
      iVar15 = movmskps(iVar39 / iVar15,auVar37);
      lVar34 = 0x10;
      if ((iVar15 == 0) &&
         (((this->output_w < 1 || (this->output_h < 1)) && (lVar34 = 8, &local_128 != top_blob)))) {
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        local_128.data = top_blob->data;
        local_128.refcount._0_4_ = SUB84(top_blob->refcount,0);
        local_128.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
        local_128.elemsize = top_blob->elemsize;
        local_128.elempack = top_blob->elempack;
        local_128.allocator = top_blob->allocator;
        uVar8 = top_blob->dims;
        uVar9 = top_blob->w;
        uVar10 = top_blob->h;
        uVar11 = top_blob->d;
        local_128.c = top_blob->c;
        local_128.cstep = top_blob->cstep;
        iVar39 = this->num_output;
        local_128.dims = uVar8;
        local_128.w = uVar9;
        local_128.h = uVar10;
        local_128.d = uVar11;
      }
      iVar27 = (iVar27 + -1) * iVar31 + (iVar18 + -1) * iVar19 + iVar3 + 1;
      iVar15 = iVar4 + 1 + (iVar20 + -1) * iVar23 + (uVar33 - 1) * iVar29;
      local_148 = bottom_blob;
      local_e0 = top_blob;
      local_a8 = opt;
      Mat::create(&local_128,iVar27,iVar15,iVar39,sVar5,*(Allocator **)(&opt->lightmode + lVar34));
      iVar18 = -100;
      if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
        uVar33 = this->kernel_w * this->kernel_h;
        __n = (size_type)(int)uVar33;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_1a1);
        piVar14 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar18 = this->kernel_h;
        if (0 < iVar18) {
          iVar39 = this->dilation_h;
          iVar31 = this->kernel_w;
          iVar19 = this->dilation_w * iVar31;
          iVar20 = 0;
          iVar23 = 0;
          iVar29 = 0;
          do {
            if (0 < iVar31) {
              lVar34 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar20 + lVar34] = iVar23;
                iVar23 = iVar23 + this->dilation_w;
                iVar31 = this->kernel_w;
                lVar34 = lVar34 + 1;
              } while ((int)lVar34 < iVar31);
              iVar20 = iVar20 + (int)lVar34;
              iVar18 = this->kernel_h;
            }
            iVar23 = iVar23 + (iVar39 * iVar27 - iVar19);
            iVar29 = iVar29 + 1;
          } while (iVar29 < iVar18);
        }
        uVar17 = this->group;
        uVar16 = (uint)local_140;
        if (uVar17 == this->num_output && uVar16 == uVar17) {
          if (0 < (int)uVar16) {
            local_190 = local_148->data;
            local_160 = local_148->cstep * local_148->elemsize;
            pvVar26 = (this->weight_data).data;
            local_148 = (Mat *)CONCAT44(local_148._4_4_,local_128.dims);
            local_138 = (void *)(local_128.cstep * local_128.elemsize);
            local_150 = (void *)CONCAT44(local_150._4_4_,local_128.h * local_128.w);
            local_158 = CONCAT44(local_158._4_4_,this->bias_term);
            local_c8 = (this->bias_data).data;
            local_170 = (void *)(local_128.elemsize * (long)local_128.w);
            local_188 = (ulong)(uint)(iVar15 * iVar27);
            local_178 = (float *)(this->activation_params).data;
            lVar34 = (long)local_128.data + 0xc;
            pvVar32 = (void *)0x0;
            local_1a0 = (ulong)(this->activation_type - 1);
            local_168 = local_128.data;
            pvVar30 = local_128.data;
            auVar44 = _DAT_003126a0;
            auVar45 = _DAT_003126b0;
            auVar37 = _DAT_00312630;
            do {
              iVar15 = 1;
              if ((int)local_148 != 3) {
                iVar15 = local_128.d;
              }
              if ((int)local_158 == 0) {
                uVar35 = 0;
              }
              else {
                uVar35 = *(undefined4 *)((long)local_c8 + (long)pvVar32 * 4);
              }
              uVar17 = iVar15 * (int)local_150;
              if (0 < (int)uVar17) {
                lVar21 = (ulong)uVar17 - 1;
                auVar38._8_4_ = (int)lVar21;
                auVar38._0_8_ = lVar21;
                auVar38._12_4_ = (int)((ulong)lVar21 >> 0x20);
                auVar38 = auVar38 ^ auVar37;
                uVar22 = 0;
                do {
                  auVar41._8_4_ = (int)uVar22;
                  auVar41._0_8_ = uVar22;
                  auVar41._12_4_ = (int)(uVar22 >> 0x20);
                  auVar43 = (auVar41 | auVar45) ^ auVar37;
                  iVar15 = auVar38._4_4_;
                  if ((bool)(~(iVar15 < auVar43._4_4_ ||
                              auVar38._0_4_ < auVar43._0_4_ && auVar43._4_4_ == iVar15) & 1)) {
                    *(undefined4 *)(lVar34 + -0xc + uVar22 * 4) = uVar35;
                  }
                  if (auVar43._12_4_ <= auVar38._12_4_ &&
                      (auVar43._8_4_ <= auVar38._8_4_ || auVar43._12_4_ != auVar38._12_4_)) {
                    *(undefined4 *)(lVar34 + -8 + uVar22 * 4) = uVar35;
                  }
                  auVar43 = (auVar41 | auVar44) ^ auVar37;
                  iVar18 = auVar43._4_4_;
                  if (iVar18 <= iVar15 && (iVar18 != iVar15 || auVar43._0_4_ <= auVar38._0_4_)) {
                    *(undefined4 *)(lVar34 + -4 + uVar22 * 4) = uVar35;
                    *(undefined4 *)(lVar34 + uVar22 * 4) = uVar35;
                  }
                  uVar22 = uVar22 + 4;
                } while ((uVar17 + 3 & 0xfffffffc) != uVar22);
              }
              if (0 < (int)local_130) {
                iVar15 = this->stride_h;
                iVar18 = this->stride_w;
                uVar22 = 0;
                do {
                  if (0 < (int)local_180) {
                    lVar21 = 0;
                    do {
                      if (0 < (int)uVar33) {
                        lVar12 = lVar21 * iVar18 * 4 +
                                 uVar22 * (long)iVar15 * (long)local_170 +
                                 (long)local_138 * (long)pvVar32;
                        uVar28 = 0;
                        do {
                          lVar24 = (long)piVar14[uVar28];
                          *(float *)((long)local_168 + lVar24 * 4 + lVar12) =
                               *(float *)((long)pvVar26 + uVar28 * 4) *
                               *(float *)((long)local_190 +
                                         lVar21 * 4 +
                                         uVar22 * local_180 * 4 + local_160 * (long)pvVar32) +
                               *(float *)((long)local_168 + lVar24 * 4 + lVar12);
                          uVar28 = uVar28 + 1;
                        } while (uVar33 != uVar28);
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != local_180);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != local_130);
              }
              local_198 = pvVar32;
              local_c0 = lVar34;
              if ((uint)local_1a0 < 4) {
                iVar15 = (int)local_188;
                switch((long)&switchD_002a8351::switchdataD_0031664c +
                       (long)(int)(&switchD_002a8351::switchdataD_0031664c)[local_1a0]) {
                case 0x2a8353:
                  if (0 < iVar15) {
                    uVar22 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar30 + uVar22 * 4);
                      if (fVar36 <= 0.0) {
                        fVar36 = 0.0;
                      }
                      *(float *)((long)pvVar30 + uVar22 * 4) = fVar36;
                      uVar22 = uVar22 + 1;
                    } while (local_188 != uVar22);
                  }
                  break;
                case 0x2a837c:
                  if (0 < iVar15) {
                    fVar36 = *local_178;
                    fVar1 = local_178[1];
                    uVar22 = 0;
                    do {
                      fVar2 = *(float *)((long)pvVar30 + uVar22 * 4);
                      fVar40 = fVar2;
                      if (fVar2 <= fVar36) {
                        fVar40 = fVar36;
                      }
                      if ((fVar2 < fVar36) || (fVar1 < fVar40)) {
                        if (fVar1 <= fVar40) {
                          fVar40 = fVar1;
                        }
                        *(float *)((long)pvVar30 + uVar22 * 4) = fVar40;
                      }
                      uVar22 = uVar22 + 1;
                    } while (local_188 != uVar22);
                  }
                  break;
                case 0x2a83bd:
                  if (0 < iVar15) {
                    fVar36 = *local_178;
                    uVar22 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar30 + uVar22 * 4);
                      uVar17 = -(uint)(0.0 < fVar1);
                      *(float *)((long)pvVar30 + uVar22 * 4) =
                           (float)(~uVar17 & (uint)fVar36 | uVar17 & 0x3f800000) * fVar1;
                      uVar22 = uVar22 + 1;
                    } while (local_188 != uVar22);
                  }
                  break;
                case 0x2a8405:
                  if (0 < iVar15) {
                    uVar22 = 0;
                    do {
                      fVar36 = expf((float)(*(uint *)((long)pvVar30 + uVar22 * 4) ^ auVar37._0_4_));
                      auVar45 = _DAT_003126b0;
                      auVar44 = _DAT_003126a0;
                      auVar37 = _DAT_00312630;
                      *(float *)((long)pvVar30 + uVar22 * 4) = 1.0 / (fVar36 + 1.0);
                      uVar22 = uVar22 + 1;
                    } while (local_188 != uVar22);
                  }
                }
              }
              pvVar32 = (void *)((long)local_198 + 1);
              lVar34 = local_c0 + (long)local_138;
              pvVar26 = (void *)((long)pvVar26 + __n * 4);
              pvVar30 = (void *)((long)pvVar30 + (long)local_138);
            } while (pvVar32 != local_140);
          }
        }
        else {
          local_a0 = (ulong)uVar17;
          uVar22 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | (ulong)local_140 & 0xffffffff
                         ) / (long)(int)uVar17;
          iVar18 = (int)uVar22;
          if (0 < (int)uVar17) {
            uVar28 = (long)this->num_output / (long)(int)uVar17;
            local_170 = (void *)(uVar28 & 0xffffffff);
            local_178 = (float *)CONCAT44(local_178._4_4_,local_128.dims);
            local_168 = (void *)(local_128.cstep * local_128.elemsize);
            local_ac = local_128.h * local_128.w;
            local_78 = (this->weight_data).data;
            local_b0 = this->bias_term;
            local_68 = local_128.elemsize * (long)local_128.w;
            local_188 = (ulong)(uint)(iVar15 * iVar27);
            local_b4 = (int)uVar28;
            local_80 = (long)local_b4;
            local_70 = (long)local_168 * local_80;
            local_b4 = local_b4 * iVar18 * uVar33;
            local_50 = (long)(int)(iVar18 * uVar33) << 2;
            local_160 = (ulong)(this->activation_type - 1);
            local_90 = (long)local_128.data + 0xc;
            local_d0 = 0;
            local_60 = local_128.data;
            local_98 = local_128.data;
            local_d8 = 0;
            auVar44 = _DAT_003126a0;
            auVar45 = _DAT_003126b0;
            auVar37 = _DAT_00312630;
            do {
              if (0 < (int)local_170) {
                local_198 = (void *)((long)local_78 + (long)(int)local_d0 * 4);
                local_c8 = (void *)(local_d8 * local_80);
                local_88 = (float *)(this->activation_params).data;
                local_58 = (this->bias_data).data;
                iVar15 = (int)local_d8;
                local_190 = (void *)0x0;
                pvVar26 = local_98;
                lVar34 = local_90;
                do {
                  iVar39 = 1;
                  if ((int)local_178 != 3) {
                    iVar39 = local_128.d;
                  }
                  if (local_b0 == 0) {
                    uVar35 = 0;
                  }
                  else {
                    uVar35 = *(undefined4 *)
                              ((long)local_58 + ((long)local_190 + (long)local_c8) * 4);
                  }
                  uVar17 = iVar39 * local_ac;
                  if (0 < (int)uVar17) {
                    lVar21 = (ulong)uVar17 - 1;
                    auVar43._8_4_ = (int)lVar21;
                    auVar43._0_8_ = lVar21;
                    auVar43._12_4_ = (int)((ulong)lVar21 >> 0x20);
                    auVar43 = auVar43 ^ auVar37;
                    uVar28 = 0;
                    do {
                      auVar42._8_4_ = (int)uVar28;
                      auVar42._0_8_ = uVar28;
                      auVar42._12_4_ = (int)(uVar28 >> 0x20);
                      auVar38 = (auVar42 | auVar45) ^ auVar37;
                      iVar39 = auVar43._4_4_;
                      if ((bool)(~(iVar39 < auVar38._4_4_ ||
                                  auVar43._0_4_ < auVar38._0_4_ && auVar38._4_4_ == iVar39) & 1)) {
                        *(undefined4 *)(lVar34 + -0xc + uVar28 * 4) = uVar35;
                      }
                      if (auVar38._12_4_ <= auVar43._12_4_ &&
                          (auVar38._8_4_ <= auVar43._8_4_ || auVar38._12_4_ != auVar43._12_4_)) {
                        *(undefined4 *)(lVar34 + -8 + uVar28 * 4) = uVar35;
                      }
                      auVar42 = (auVar42 | auVar44) ^ auVar37;
                      iVar27 = auVar42._4_4_;
                      if (iVar27 <= iVar39 && (iVar27 != iVar39 || auVar42._0_4_ <= auVar43._0_4_))
                      {
                        *(undefined4 *)(lVar34 + -4 + uVar28 * 4) = uVar35;
                        *(undefined4 *)(lVar34 + uVar28 * 4) = uVar35;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar17 + 3 & 0xfffffffc) != uVar28);
                  }
                  if (0 < (int)local_130) {
                    local_138 = (void *)(((long)local_190 + (long)local_c8) * (long)local_168 +
                                        (long)local_60);
                    local_140 = (void *)(this->stride_h * local_68);
                    local_c0 = (long)this->stride_w;
                    local_1a0 = 0;
                    do {
                      if (0 < (int)local_180) {
                        iVar39 = local_148->w;
                        sVar5 = local_148->elemsize;
                        sVar7 = local_148->cstep;
                        pvVar30 = local_148->data;
                        lVar21 = 0;
                        do {
                          if (0 < iVar18) {
                            lVar12 = lVar21 * local_c0 * 4 + local_1a0 * (long)local_140;
                            uVar28 = 0;
                            pvVar32 = local_198;
                            do {
                              if (0 < (int)uVar33) {
                                fVar36 = *(float *)((long)pvVar30 +
                                                   (uVar28 + (uint)(iVar18 * iVar15)) *
                                                   sVar7 * sVar5 +
                                                   lVar21 * 4 + (long)iVar39 * local_1a0 * sVar5);
                                uVar25 = 0;
                                do {
                                  lVar24 = (long)piVar14[uVar25];
                                  *(float *)((long)local_138 + lVar24 * 4 + lVar12) =
                                       *(float *)((long)pvVar32 + uVar25 * 4) * fVar36 +
                                       *(float *)((long)local_138 + lVar24 * 4 + lVar12);
                                  uVar25 = uVar25 + 1;
                                } while (uVar33 != uVar25);
                              }
                              uVar28 = uVar28 + 1;
                              pvVar32 = (void *)((long)pvVar32 + __n * 4);
                            } while (uVar28 != (uVar22 & 0xffffffff));
                          }
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != local_180);
                      }
                      local_1a0 = local_1a0 + 1;
                    } while (local_1a0 != local_130);
                  }
                  local_158 = lVar34;
                  local_150 = pvVar26;
                  if ((uint)local_160 < 4) {
                    iVar39 = (int)local_188;
                    switch((long)&switchD_002a88e8::switchdataD_0031663c +
                           (long)(int)(&switchD_002a88e8::switchdataD_0031663c)[local_160]) {
                    case 0x2a88ea:
                      if (0 < iVar39) {
                        uVar28 = 0;
                        do {
                          fVar36 = *(float *)((long)pvVar26 + uVar28 * 4);
                          if (fVar36 <= 0.0) {
                            fVar36 = 0.0;
                          }
                          *(float *)((long)pvVar26 + uVar28 * 4) = fVar36;
                          uVar28 = uVar28 + 1;
                        } while (local_188 != uVar28);
                      }
                      break;
                    case 0x2a8913:
                      if (0 < iVar39) {
                        fVar36 = *local_88;
                        fVar1 = local_88[1];
                        uVar28 = 0;
                        do {
                          fVar2 = *(float *)((long)pvVar26 + uVar28 * 4);
                          fVar40 = fVar2;
                          if (fVar2 <= fVar36) {
                            fVar40 = fVar36;
                          }
                          if ((fVar2 < fVar36) || (fVar1 < fVar40)) {
                            if (fVar1 <= fVar40) {
                              fVar40 = fVar1;
                            }
                            *(float *)((long)pvVar26 + uVar28 * 4) = fVar40;
                          }
                          uVar28 = uVar28 + 1;
                        } while (local_188 != uVar28);
                      }
                      break;
                    case 0x2a8957:
                      if (0 < iVar39) {
                        uVar28 = 0;
                        do {
                          fVar36 = expf((float)(*(uint *)((long)local_150 + uVar28 * 4) ^
                                               auVar37._0_4_));
                          auVar45 = _DAT_003126b0;
                          auVar44 = _DAT_003126a0;
                          auVar37 = _DAT_00312630;
                          *(float *)((long)local_150 + uVar28 * 4) = 1.0 / (fVar36 + 1.0);
                          uVar28 = uVar28 + 1;
                        } while (local_188 != uVar28);
                      }
                      break;
                    case 0x2a89c6:
                      if (0 < iVar39) {
                        fVar36 = *local_88;
                        uVar28 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar26 + uVar28 * 4);
                          uVar17 = -(uint)(0.0 < fVar1);
                          *(float *)((long)pvVar26 + uVar28 * 4) =
                               (float)(~uVar17 & (uint)fVar36 | uVar17 & 0x3f800000) * fVar1;
                          uVar28 = uVar28 + 1;
                        } while (local_188 != uVar28);
                      }
                    }
                  }
                  local_190 = (void *)((long)local_190 + 1);
                  lVar34 = local_158 + (long)local_168;
                  local_198 = (void *)((long)local_198 + local_50);
                  pvVar26 = (void *)((long)local_150 + (long)local_168);
                } while (local_190 != local_170);
              }
              local_d8 = local_d8 + 1;
              local_90 = local_90 + local_70;
              local_d0 = (ulong)(uint)((int)local_d0 + local_b4);
              local_98 = (void *)((long)local_98 + local_70);
            } while (local_d8 != local_a0);
          }
        }
        pMVar13 = local_e0;
        cut_padding(this,&local_128,local_e0,local_a8);
        if ((pMVar13->data == (void *)0x0) || (iVar18 = 0, (long)pMVar13->c * pMVar13->cstep == 0))
        {
          iVar18 = -100;
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if (local_128.data != (void *)0x0) {
              free(local_128.data);
            }
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  return iVar18;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i * w + j];
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}